

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_STOCHRSI_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,
                   int *outNBElement)

{
  TA_RetCode TVar1;
  undefined8 unaff_RBP;
  int unaff_retaddr;
  int unaff_retaddr_00;
  double *in_stack_00000008;
  int in_stack_00000014;
  int in_stack_00000018;
  int *in_stack_00000048;
  int *in_stack_00000050;
  double *in_stack_00000058;
  double *in_stack_00000060;
  
  TVar1 = TA_STOCHRSI(in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr_00,
                      unaff_retaddr,(int)((ulong)unaff_RBP >> 0x20),(TA_MAType)params,
                      in_stack_00000048,in_stack_00000050,in_stack_00000058,in_stack_00000060);
  return TVar1;
}

Assistant:

TA_RetCode TA_STOCHRSI_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_STOCHRSI(
/* Generated */                  startIdx,
/* Generated */                  endIdx,
/* Generated */                  params->in[0].data.inReal, /* inReal */
/* Generated */                  params->optIn[0].data.optInInteger, /* optInTimePeriod*/
/* Generated */                  params->optIn[1].data.optInInteger, /* optInFastK_Period*/
/* Generated */                  params->optIn[2].data.optInInteger, /* optInFastD_Period*/
/* Generated */                  (TA_MAType)params->optIn[3].data.optInInteger, /* optInFastD_MAType*/
/* Generated */                  outBegIdx, 
/* Generated */                  outNBElement, 
/* Generated */                  params->out[0].data.outReal, /*  outFastK */
/* Generated */                  params->out[1].data.outReal /*  outFastD */ );
/* Generated */ }